

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool fun_00;
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  unsigned_long *puVar4;
  unsigned_long uVar5;
  byte in_CL;
  Vector *in_RDX;
  unsigned_long *result_data;
  unsigned_long *rdata;
  unsigned_long *ldata;
  ValidityMask *in_stack_ffffffffffffffa8;
  unsigned_long left_00;
  
  fun_00 = (bool)(in_CL & 1);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  puVar2 = ConstantVector::GetData<unsigned_long>((Vector *)0xe60734);
  puVar3 = ConstantVector::GetData<unsigned_long>((Vector *)0xe60743);
  puVar4 = ConstantVector::GetData<unsigned_long>((Vector *)0xe60752);
  bVar1 = ConstantVector::IsNull((Vector *)0xe60761);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xe6076f), !bVar1)) {
    uVar5 = *puVar2;
    left_00 = *puVar3;
    ConstantVector::Validity(in_RDX);
    uVar5 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::BitwiseXOROperator,unsigned_long,unsigned_long,unsigned_long>
                      (fun_00,left_00,uVar5,in_stack_ffffffffffffffa8,0xe607d2);
    *puVar4 = uVar5;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}